

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_Shift(ShiftForm1 Shift)

{
  byte bVar1;
  uint32_t uVar2;
  code *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar3;
  undefined1 auVar4 [16];
  undefined8 uVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Image output;
  double shiftY;
  double shiftX;
  Image input;
  uint8_t intensity;
  undefined7 in_stack_fffffffffffffef8;
  uint8_t in_stack_fffffffffffffeff;
  undefined6 in_stack_ffffffffffffff00;
  uint8_t in_stack_ffffffffffffff06;
  uint8_t in_stack_ffffffffffffff07;
  double in_stack_ffffffffffffff08;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff10;
  Image *in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 local_a8 [40];
  double local_80;
  double local_78;
  ImageTemplate<unsigned_char> local_38;
  uint8_t local_9;
  code *local_8;
  
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff10,(uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             SUB84(in_stack_ffffffffffffff08,0),in_stack_ffffffffffffff07,in_stack_ffffffffffffff06)
  ;
  Test_Helper::uniformImage
            ((uint8_t)((ulong)in_stack_ffffffffffffff28 >> 0x38),(uint32_t)in_stack_ffffffffffffff28
             ,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e19b5);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
  auVar4._0_8_ = (double)(uVar2 >> 2);
  auVar4._8_8_ = in_XMM0_Qa;
  auVar7._8_8_ = 0x8000000000000000;
  auVar7._0_8_ = 0x8000000000000000;
  vpor_avx(auVar4,auVar7);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
  dVar3 = Unit_Test::randomFloatValue<double>
                    (in_stack_ffffffffffffff08,
                     (double)CONCAT17(in_stack_ffffffffffffff07,
                                      CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00))
                     ,(double)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  local_78 = Unit_Test::randomFloatValue<double>
                       (in_stack_ffffffffffffff08,
                        (double)CONCAT17(in_stack_ffffffffffffff07,
                                         CONCAT16(in_stack_ffffffffffffff06,
                                                  in_stack_ffffffffffffff00)),
                        (double)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  local_78 = dVar3 + local_78;
  uVar6 = 0;
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
  auVar5._0_8_ = (double)(uVar2 >> 2);
  auVar5._8_8_ = uVar6;
  auVar8._8_8_ = 0x8000000000000000;
  auVar8._0_8_ = 0x8000000000000000;
  vpor_avx(auVar5,auVar8);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
  dVar3 = Unit_Test::randomFloatValue<double>
                    (in_stack_ffffffffffffff08,
                     (double)CONCAT17(in_stack_ffffffffffffff07,
                                      CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00))
                     ,(double)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  local_80 = Unit_Test::randomFloatValue<double>
                       (in_stack_ffffffffffffff08,
                        (double)CONCAT17(in_stack_ffffffffffffff07,
                                         CONCAT16(in_stack_ffffffffffffff06,
                                                  in_stack_ffffffffffffff00)),
                        (double)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  local_80 = dVar3 + local_80;
  (*local_8)(local_78,local_80,local_a8,&local_38);
  bVar1 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(in_stack_ffffffffffffff07,
                                       CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)
                                      ),in_stack_fffffffffffffeff);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e1b4a);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e1b57);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form1_Shift(ShiftForm1 Shift)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        const double shiftX = randomFloatValue<double>( -static_cast<double>( input.width()  / 4 ), input.width() / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );
        const double shiftY = randomFloatValue<double>( -static_cast<double>( input.height() / 4 ), input.height() / 4, 1 ) + randomFloatValue<double>( 0, 1, 0.01 );

        const PenguinV_Image::Image output = Shift( input, shiftX, shiftY );

        return verifyImage( output, intensity );
    }